

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

void CodeResiduals(VP8BitWriter *bw,VP8EncIterator *it,VP8ModeScore *rd)

{
  VP8Encoder *enc_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long in_RDX;
  VP8EncIterator *in_RSI;
  VP8BitWriter *in_RDI;
  int ctx_1;
  int ctx;
  VP8Encoder *enc;
  int segment;
  int i16;
  uint64_t pos3;
  uint64_t pos2;
  uint64_t pos1;
  VP8Residual res;
  int ch;
  int y;
  int x;
  VP8Residual *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  VP8BitWriter *in_stack_ffffffffffffffb8;
  int local_24;
  int local_20;
  int local_1c;
  
  uVar1 = (uint)(((uint)*in_RSI->mb & 3) == 1);
  uVar2 = (uint)(*(byte *)in_RSI->mb >> 5 & 3);
  enc_00 = in_RSI->enc;
  VP8IteratorNzToBytes(in_RSI);
  uVar4 = VP8BitWriterPos(in_RDI);
  if (uVar1 == 0) {
    VP8InitResidual(0,3,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  }
  else {
    VP8InitResidual(0,1,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
    (*VP8SetResidualCoeffs)((int16_t *)(in_RDX + 0x28),(VP8Residual *)&stack0xffffffffffffffa8);
    iVar3 = PutCoeffs(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8)
    ;
    in_RSI->left_nz[8] = iVar3;
    in_RSI->top_nz[8] = iVar3;
    VP8InitResidual(1,0,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  }
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      (*VP8SetResidualCoeffs)
                ((int16_t *)(in_RDX + 0x48 + (long)(local_1c + local_20 * 4) * 0x20),
                 (VP8Residual *)&stack0xffffffffffffffa8);
      iVar3 = PutCoeffs(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                        in_stack_ffffffffffffffa8);
      in_RSI->left_nz[local_20] = iVar3;
      in_RSI->top_nz[local_1c] = iVar3;
    }
  }
  uVar5 = VP8BitWriterPos(in_RDI);
  VP8InitResidual(0,2,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 2) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
        (*VP8SetResidualCoeffs)
                  ((int16_t *)
                   (in_RDX + 0x248 + (long)(local_24 * 2 + local_1c + local_20 * 2) * 0x20),
                   (VP8Residual *)&stack0xffffffffffffffa8);
        iVar3 = PutCoeffs(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          in_stack_ffffffffffffffa8);
        in_RSI->left_nz[local_24 + 4 + local_20] = iVar3;
        in_RSI->top_nz[local_24 + 4 + local_1c] = iVar3;
      }
    }
  }
  uVar6 = VP8BitWriterPos(in_RDI);
  in_RSI->luma_bits = uVar5 - uVar4;
  in_RSI->uv_bits = uVar6 - uVar5;
  in_RSI->bit_count[(int)uVar2][(int)uVar1] =
       in_RSI->luma_bits + in_RSI->bit_count[(int)uVar2][(int)uVar1];
  in_RSI->bit_count[(int)uVar2][2] = in_RSI->uv_bits + in_RSI->bit_count[(int)uVar2][2];
  VP8IteratorBytesToNz(in_RSI);
  return;
}

Assistant:

static void CodeResiduals(VP8BitWriter* const bw, VP8EncIterator* const it,
                          const VP8ModeScore* const rd) {
  int x, y, ch;
  VP8Residual res;
  uint64_t pos1, pos2, pos3;
  const int i16 = (it->mb->type == 1);
  const int segment = it->mb->segment;
  VP8Encoder* const enc = it->enc;

  VP8IteratorNzToBytes(it);

  pos1 = VP8BitWriterPos(bw);
  if (i16) {
    VP8InitResidual(0, 1, enc, &res);
    VP8SetResidualCoeffs(rd->y_dc_levels, &res);
    it->top_nz[8] = it->left_nz[8] =
        PutCoeffs(bw, it->top_nz[8] + it->left_nz[8], &res);
    VP8InitResidual(1, 0, enc, &res);
  } else {
    VP8InitResidual(0, 3, enc, &res);
  }

  // luma-AC
  for (y = 0; y < 4; ++y) {
    for (x = 0; x < 4; ++x) {
      const int ctx = it->top_nz[x] + it->left_nz[y];
      VP8SetResidualCoeffs(rd->y_ac_levels[x + y * 4], &res);
      it->top_nz[x] = it->left_nz[y] = PutCoeffs(bw, ctx, &res);
    }
  }
  pos2 = VP8BitWriterPos(bw);

  // U/V
  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz[4 + ch + x] + it->left_nz[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        it->top_nz[4 + ch + x] = it->left_nz[4 + ch + y] =
            PutCoeffs(bw, ctx, &res);
      }
    }
  }
  pos3 = VP8BitWriterPos(bw);
  it->luma_bits = pos2 - pos1;
  it->uv_bits = pos3 - pos2;
  it->bit_count[segment][i16] += it->luma_bits;
  it->bit_count[segment][2] += it->uv_bits;
  VP8IteratorBytesToNz(it);
}